

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_is_in_correct_subgroup(secp256k1_ge *ge)

{
  int iVar1;
  uint uVar2;
  secp256k1_gej out;
  
  secp256k1_ge_verify(ge);
  secp256k1_gej_set_infinity(&out);
  for (uVar2 = 0x1f; uVar2 != 0xffffffff; uVar2 = uVar2 - 1) {
    secp256k1_gej_double_var(&out,&out,(secp256k1_fe *)0x0);
    if ((0xdU >> (uVar2 & 0x1f) & 1) != 0) {
      secp256k1_gej_add_ge_var(&out,&out,ge,(secp256k1_fe *)0x0);
    }
  }
  iVar1 = secp256k1_gej_is_infinity(&out);
  return iVar1;
}

Assistant:

static int secp256k1_ge_is_in_correct_subgroup(const secp256k1_ge* ge) {
#ifdef EXHAUSTIVE_TEST_ORDER
    secp256k1_gej out;
    int i;
    SECP256K1_GE_VERIFY(ge);

    /* A very simple EC multiplication ladder that avoids a dependency on ecmult. */
    secp256k1_gej_set_infinity(&out);
    for (i = 0; i < 32; ++i) {
        secp256k1_gej_double_var(&out, &out, NULL);
        if ((((uint32_t)EXHAUSTIVE_TEST_ORDER) >> (31 - i)) & 1) {
            secp256k1_gej_add_ge_var(&out, &out, ge, NULL);
        }
    }
    return secp256k1_gej_is_infinity(&out);
#else
    SECP256K1_GE_VERIFY(ge);

    (void)ge;
    /* The real secp256k1 group has cofactor 1, so the subgroup is the entire curve. */
    return 1;
#endif
}